

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::api::json::DecodeRawTransactionResponse::DecodeRawTransactionResponse
          (DecodeRawTransactionResponse *this,DecodeRawTransactionResponse *param_1)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  
  (this->super_JsonClassBase<cfd::api::json::DecodeRawTransactionResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodeRawTransactionResponse_00655090;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->ignore_items)._M_t,&(param_1->ignore_items)._M_t);
  std::__cxx11::string::string((string *)&this->txid_,(string *)&param_1->txid_);
  std::__cxx11::string::string((string *)&this->hash_,(string *)&param_1->hash_);
  this->locktime_ = param_1->locktime_;
  uVar1 = param_1->size_;
  uVar2 = param_1->vsize_;
  uVar3 = param_1->weight_;
  this->version_ = param_1->version_;
  this->size_ = uVar1;
  this->vsize_ = uVar2;
  this->weight_ = uVar3;
  core::JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>::
  JsonObjectVector(&this->vin_,&param_1->vin_);
  core::JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>
  ::JsonObjectVector(&this->vout_,&param_1->vout_);
  return;
}

Assistant:

DecodeRawTransactionResponse() {
    CollectFieldName();
  }